

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::LowbdIntraPredTest_DISABLED_Speed_Test::
~LowbdIntraPredTest_DISABLED_Speed_Test(LowbdIntraPredTest_DISABLED_Speed_Test *this)

{
  anon_unknown.dwarf_389e9c::LowbdIntraPredTest_DISABLED_Speed_Test::
  ~LowbdIntraPredTest_DISABLED_Speed_Test((LowbdIntraPredTest_DISABLED_Speed_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(LowbdIntraPredTest, DISABLED_Speed) {
  // max block size is 64
  DECLARE_ALIGNED(16, uint8_t, left_col[2 * 64]);
  DECLARE_ALIGNED(16, uint8_t, above_data[2 * 64 + 64]);
  DECLARE_ALIGNED(16, uint8_t, dst[3 * 64 * 64]);
  DECLARE_ALIGNED(16, uint8_t, ref_dst[3 * 64 * 64]);
  av1_zero(left_col);
  av1_zero(above_data);
  RunSpeedTest(left_col, above_data, dst, ref_dst);
}